

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playermenu.cpp
# Opt level: O2

void __thiscall FSliderItem::Drawer(FSliderItem *this,bool selected)

{
  int iVar1;
  int iVar2;
  BYTE *string;
  EColorRange *pEVar3;
  
  string = (BYTE *)(this->mText).Chars;
  if (*string == '$') {
    string = (BYTE *)FStringTable::operator()(&GStrings,(char *)(string + 1));
  }
  pEVar3 = &OptionSettings.mFontColorSelection;
  if (!selected) {
    pEVar3 = &this->mFontColor;
  }
  DCanvas::DrawText((DCanvas *)screen,this->mFont,*pEVar3,
                    (this->super_FListMenuItemSelectable).super_FListMenuItem.mXpos,
                    (this->super_FListMenuItemSelectable).super_FListMenuItem.mYpos,(char *)string,
                    0x40001390,1,0);
  iVar1 = FFont::StringWidth(SmallFont,(BYTE *)"Green");
  iVar1 = iVar1 + (this->super_FListMenuItemSelectable).super_FListMenuItem.mXpos + 8;
  iVar2 = FFont::StringWidth(SmallFont,string);
  iVar2 = iVar2 + (this->super_FListMenuItemSelectable).super_FListMenuItem.mXpos + 8;
  if (iVar1 < iVar2) {
    iVar1 = iVar2;
  }
  DrawSlider(this,iVar1,(this->super_FListMenuItemSelectable).super_FListMenuItem.mYpos);
  return;
}

Assistant:

void FSliderItem::Drawer(bool selected)
{
	const char *text = mText;

	if (*text == '$') text = GStrings(text+1);
	screen->DrawText(mFont, selected? OptionSettings.mFontColorSelection : mFontColor, mXpos, mYpos, text, DTA_Clean, true, TAG_DONE);

	int x = SmallFont->StringWidth ("Green") + 8 + mXpos;
	int x2 = SmallFont->StringWidth (text) + 8 + mXpos;
	DrawSlider (MAX(x2, x), mYpos);
}